

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs_active.cc
# Opt level: O0

base_learner * cs_active_setup(options_i *options,vw *all)

{
  parser *ppVar1;
  _func_void_shared_data_ptr_float *p_Var2;
  undefined *puVar3;
  undefined *puVar4;
  undefined *puVar5;
  undefined *puVar6;
  undefined *puVar7;
  undefined *puVar8;
  undefined *puVar9;
  byte bVar10;
  bool bVar11;
  pointer pcVar12;
  undefined8 uVar13;
  ostream *this;
  learner<cs_active,_example> *this_00;
  id in_RSI;
  long *in_RDI;
  base_learner *b;
  learner<cs_active,_example> *l;
  uint32_t i;
  stringstream __msg_4;
  stringstream __msg_3;
  stringstream __msg_2;
  stringstream __msg_1;
  stringstream __msg;
  string loss_function_type;
  option_group_definition new_options;
  int domination;
  bool simulation;
  free_ptr<cs_active> data;
  string *in_stack_ffffffffffffe848;
  prediction_type_t pVar14;
  vw *in_stack_ffffffffffffe850;
  string *in_stack_ffffffffffffe858;
  typed_option<float> *in_stack_ffffffffffffe860;
  string *in_stack_ffffffffffffe868;
  free_ptr<cs_active> *in_stack_ffffffffffffe870;
  int iVar15;
  learner<cs_active,_example> *this_01;
  char *in_stack_ffffffffffffe878;
  vw_exception *in_stack_ffffffffffffe880;
  undefined4 in_stack_ffffffffffffe898;
  undefined4 in_stack_ffffffffffffe89c;
  uint uVar16;
  option_group_definition *in_stack_ffffffffffffe8a0;
  shared_data *psVar17;
  allocator *l_00;
  uint local_1498;
  allocator local_1491;
  string local_1490 [39];
  undefined1 local_1469;
  stringstream local_1448 [16];
  ostream local_1438;
  allocator local_12b9;
  string local_12b8 [39];
  undefined1 local_1291;
  stringstream local_1270 [16];
  ostream local_1260;
  allocator local_10e1;
  string local_10e0 [39];
  undefined1 local_10b9;
  stringstream local_1098 [16];
  ostream local_1088;
  allocator local_f09;
  string local_f08 [39];
  undefined1 local_ee1;
  stringstream local_ec0 [16];
  ostream local_eb0;
  allocator local_d31;
  string local_d30 [39];
  undefined1 local_d09;
  stringstream local_ce8 [16];
  ostream local_cd8;
  string local_b60 [32];
  undefined4 local_b40;
  allocator local_b39;
  string local_b38 [39];
  allocator local_b11;
  string local_b10 [39];
  allocator local_ae9;
  string local_ae8 [39];
  allocator local_ac1;
  string local_ac0 [199];
  allocator local_9f9;
  string local_9f8 [39];
  allocator local_9d1;
  string local_9d0 [199];
  allocator local_909;
  string local_908 [39];
  allocator local_8e1;
  string local_8e0 [199];
  allocator local_819;
  string local_818 [39];
  allocator local_7f1;
  string local_7f0 [199];
  allocator local_729;
  string local_728 [39];
  allocator local_701;
  string local_700 [199];
  allocator local_639;
  string local_638 [39];
  allocator local_611;
  string local_610 [199];
  allocator local_549;
  string local_548 [39];
  allocator local_521;
  string local_520 [199];
  allocator local_459;
  string local_458 [39];
  allocator local_431;
  string local_430 [199];
  allocator local_369;
  string local_368 [39];
  allocator local_341;
  string local_340 [199];
  allocator local_279;
  string local_278 [39];
  allocator local_251;
  string local_250 [199];
  allocator local_189;
  string local_188 [39];
  allocator local_161;
  string local_160 [32];
  typed_option<unsigned_int> local_140;
  allocator local_89;
  string local_88 [32];
  undefined1 local_68 [56];
  int local_30;
  byte local_29;
  undefined1 local_28 [32];
  AllReduce *local_8;
  
  local_28._16_8_ = in_RSI._M_thread;
  local_28._24_8_ = in_RDI;
  scoped_calloc_or_throw<cs_active>();
  local_29 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"Cost-sensitive Active Learning",&local_89);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_ffffffffffffe850,in_stack_ffffffffffffe848);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_160,"cs_active",&local_161);
  std::unique_ptr<cs_active,_void_(*)(void_*)>::operator->
            ((unique_ptr<cs_active,_void_(*)(void_*)> *)0x2c0060);
  VW::config::make_option<unsigned_int>(in_stack_ffffffffffffe858,(uint *)in_stack_ffffffffffffe850)
  ;
  VW::config::typed_option<unsigned_int>::keep(&local_140,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_188,"Cost-sensitive active learning with <k> costs",&local_189)
  ;
  VW::config::typed_option<unsigned_int>::help
            ((typed_option<unsigned_int> *)in_stack_ffffffffffffe850,in_stack_ffffffffffffe848);
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
            (in_stack_ffffffffffffe8a0,
             (typed_option<unsigned_int> *)
             CONCAT44(in_stack_ffffffffffffe89c,in_stack_ffffffffffffe898));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_250,"simulation",&local_251);
  VW::config::make_option<bool>(in_stack_ffffffffffffe858,(bool *)in_stack_ffffffffffffe850);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_278,"cost-sensitive active learning simulation mode",&local_279);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_ffffffffffffe850,in_stack_ffffffffffffe848);
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_ffffffffffffe8a0,
             (typed_option<bool> *)CONCAT44(in_stack_ffffffffffffe89c,in_stack_ffffffffffffe898));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_340,"baseline",&local_341);
  std::unique_ptr<cs_active,_void_(*)(void_*)>::operator->
            ((unique_ptr<cs_active,_void_(*)(void_*)> *)0x2c020e);
  VW::config::make_option<bool>(in_stack_ffffffffffffe858,(bool *)in_stack_ffffffffffffe850);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_368,"cost-sensitive active learning baseline",&local_369);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_ffffffffffffe850,in_stack_ffffffffffffe848);
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_ffffffffffffe8a0,
             (typed_option<bool> *)CONCAT44(in_stack_ffffffffffffe89c,in_stack_ffffffffffffe898));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_430,"domination",&local_431);
  VW::config::make_option<int>(in_stack_ffffffffffffe858,(int *)in_stack_ffffffffffffe850);
  VW::config::typed_option<int>::default_value
            ((typed_option<int> *)in_stack_ffffffffffffe860,
             (int)((ulong)in_stack_ffffffffffffe858 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_458,"cost-sensitive active learning use domination. Default 1",&local_459);
  VW::config::typed_option<int>::help
            ((typed_option<int> *)in_stack_ffffffffffffe850,in_stack_ffffffffffffe848);
  VW::config::option_group_definition::add<VW::config::typed_option<int>&>
            (in_stack_ffffffffffffe8a0,
             (typed_option<int> *)CONCAT44(in_stack_ffffffffffffe89c,in_stack_ffffffffffffe898));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_520,"mellowness",&local_521);
  std::unique_ptr<cs_active,_void_(*)(void_*)>::operator->
            ((unique_ptr<cs_active,_void_(*)(void_*)> *)0x2c03bc);
  VW::config::make_option<float>(in_stack_ffffffffffffe858,(float *)in_stack_ffffffffffffe850);
  VW::config::typed_option<float>::default_value
            (in_stack_ffffffffffffe860,(float)((ulong)in_stack_ffffffffffffe858 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_548,"mellowness parameter c_0. Default 0.1.",&local_549);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_ffffffffffffe850,in_stack_ffffffffffffe848);
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>
            (in_stack_ffffffffffffe8a0,
             (typed_option<float> *)CONCAT44(in_stack_ffffffffffffe89c,in_stack_ffffffffffffe898));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_610,"range_c",&local_611);
  std::unique_ptr<cs_active,_void_(*)(void_*)>::operator->
            ((unique_ptr<cs_active,_void_(*)(void_*)> *)0x2c04a6);
  VW::config::make_option<float>(in_stack_ffffffffffffe858,(float *)in_stack_ffffffffffffe850);
  VW::config::typed_option<float>::default_value
            (in_stack_ffffffffffffe860,(float)((ulong)in_stack_ffffffffffffe858 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_638,
             "parameter controlling the threshold for per-label cost uncertainty. Default 0.5.",
             &local_639);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_ffffffffffffe850,in_stack_ffffffffffffe848);
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>
            (in_stack_ffffffffffffe8a0,
             (typed_option<float> *)CONCAT44(in_stack_ffffffffffffe89c,in_stack_ffffffffffffe898));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_700,"max_labels",&local_701);
  std::unique_ptr<cs_active,_void_(*)(void_*)>::operator->
            ((unique_ptr<cs_active,_void_(*)(void_*)> *)0x2c0594);
  VW::config::make_option<unsigned_long>
            (in_stack_ffffffffffffe858,(unsigned_long *)in_stack_ffffffffffffe850);
  VW::config::typed_option<unsigned_long>::default_value
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffe860,
             (unsigned_long)in_stack_ffffffffffffe858);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_728,"maximum number of label queries.",&local_729);
  VW::config::typed_option<unsigned_long>::help
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffe850,in_stack_ffffffffffffe848);
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
            (in_stack_ffffffffffffe8a0,
             (typed_option<unsigned_long> *)
             CONCAT44(in_stack_ffffffffffffe89c,in_stack_ffffffffffffe898));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7f0,"min_labels",&local_7f1);
  std::unique_ptr<cs_active,_void_(*)(void_*)>::operator->
            ((unique_ptr<cs_active,_void_(*)(void_*)> *)0x2c0681);
  VW::config::make_option<unsigned_long>
            (in_stack_ffffffffffffe858,(unsigned_long *)in_stack_ffffffffffffe850);
  VW::config::typed_option<unsigned_long>::default_value
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffe860,
             (unsigned_long)in_stack_ffffffffffffe858);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_818,"minimum number of label queries.",&local_819);
  VW::config::typed_option<unsigned_long>::help
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffe850,in_stack_ffffffffffffe848);
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
            (in_stack_ffffffffffffe8a0,
             (typed_option<unsigned_long> *)
             CONCAT44(in_stack_ffffffffffffe89c,in_stack_ffffffffffffe898));
  l_00 = &local_8e1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8e0,"cost_max",l_00);
  std::unique_ptr<cs_active,_void_(*)(void_*)>::operator->
            ((unique_ptr<cs_active,_void_(*)(void_*)> *)0x2c076e);
  VW::config::make_option<float>(in_stack_ffffffffffffe858,(float *)in_stack_ffffffffffffe850);
  VW::config::typed_option<float>::default_value
            (in_stack_ffffffffffffe860,(float)((ulong)in_stack_ffffffffffffe858 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_908,"cost upper bound. Default 1.",&local_909);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_ffffffffffffe850,in_stack_ffffffffffffe848);
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>
            (in_stack_ffffffffffffe8a0,
             (typed_option<float> *)CONCAT44(in_stack_ffffffffffffe89c,in_stack_ffffffffffffe898));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9d0,"cost_min",&local_9d1);
  std::unique_ptr<cs_active,_void_(*)(void_*)>::operator->
            ((unique_ptr<cs_active,_void_(*)(void_*)> *)0x2c085c);
  VW::config::make_option<float>(in_stack_ffffffffffffe858,(float *)in_stack_ffffffffffffe850);
  VW::config::typed_option<float>::default_value
            (in_stack_ffffffffffffe860,(float)((ulong)in_stack_ffffffffffffe858 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9f8,"cost lower bound. Default 0.",&local_9f9);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_ffffffffffffe850,in_stack_ffffffffffffe848);
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>
            (in_stack_ffffffffffffe8a0,
             (typed_option<float> *)CONCAT44(in_stack_ffffffffffffe89c,in_stack_ffffffffffffe898));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ac0,"csa_debug",&local_ac1);
  std::unique_ptr<cs_active,_void_(*)(void_*)>::operator->
            ((unique_ptr<cs_active,_void_(*)(void_*)> *)0x2c0945);
  VW::config::make_option<bool>(in_stack_ffffffffffffe858,(bool *)in_stack_ffffffffffffe850);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ae8,"print debug stuff for cs_active",&local_ae9);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_ffffffffffffe850,in_stack_ffffffffffffe848);
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_ffffffffffffe8a0,
             (typed_option<bool> *)CONCAT44(in_stack_ffffffffffffe89c,in_stack_ffffffffffffe898));
  std::__cxx11::string::~string(local_ae8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ae9);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffe850);
  std::__cxx11::string::~string(local_ac0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ac1);
  std::__cxx11::string::~string(local_9f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_9f9);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffe850);
  std::__cxx11::string::~string(local_9d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_9d1);
  std::__cxx11::string::~string(local_908);
  std::allocator<char>::~allocator((allocator<char> *)&local_909);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffe850);
  std::__cxx11::string::~string(local_8e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_8e1);
  std::__cxx11::string::~string(local_818);
  std::allocator<char>::~allocator((allocator<char> *)&local_819);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffe850);
  std::__cxx11::string::~string(local_7f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7f1);
  std::__cxx11::string::~string(local_728);
  std::allocator<char>::~allocator((allocator<char> *)&local_729);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffe850);
  std::__cxx11::string::~string(local_700);
  std::allocator<char>::~allocator((allocator<char> *)&local_701);
  std::__cxx11::string::~string(local_638);
  std::allocator<char>::~allocator((allocator<char> *)&local_639);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffe850);
  std::__cxx11::string::~string(local_610);
  std::allocator<char>::~allocator((allocator<char> *)&local_611);
  std::__cxx11::string::~string(local_548);
  std::allocator<char>::~allocator((allocator<char> *)&local_549);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffe850);
  std::__cxx11::string::~string(local_520);
  std::allocator<char>::~allocator((allocator<char> *)&local_521);
  std::__cxx11::string::~string(local_458);
  std::allocator<char>::~allocator((allocator<char> *)&local_459);
  VW::config::typed_option<int>::~typed_option((typed_option<int> *)in_stack_ffffffffffffe850);
  std::__cxx11::string::~string(local_430);
  std::allocator<char>::~allocator((allocator<char> *)&local_431);
  std::__cxx11::string::~string(local_368);
  std::allocator<char>::~allocator((allocator<char> *)&local_369);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffe850);
  std::__cxx11::string::~string(local_340);
  std::allocator<char>::~allocator((allocator<char> *)&local_341);
  std::__cxx11::string::~string(local_278);
  std::allocator<char>::~allocator((allocator<char> *)&local_279);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffe850);
  std::__cxx11::string::~string(local_250);
  std::allocator<char>::~allocator((allocator<char> *)&local_251);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator((allocator<char> *)&local_189);
  VW::config::typed_option<unsigned_int>::~typed_option
            ((typed_option<unsigned_int> *)in_stack_ffffffffffffe850);
  std::__cxx11::string::~string(local_160);
  std::allocator<char>::~allocator((allocator<char> *)&local_161);
  (*(code *)**(undefined8 **)local_28._24_8_)(local_28._24_8_,local_68);
  pcVar12 = std::unique_ptr<cs_active,_void_(*)(void_*)>::operator->
                      ((unique_ptr<cs_active,_void_(*)(void_*)> *)0x2c0cbe);
  uVar13 = local_28._24_8_;
  pcVar12->use_domination = true;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b10,"domination",&local_b11);
  bVar10 = (**(code **)(*(long *)uVar13 + 8))(uVar13,local_b10);
  std::__cxx11::string::~string(local_b10);
  std::allocator<char>::~allocator((allocator<char> *)&local_b11);
  if ((bVar10 & 1) != 0 && local_30 == 0) {
    pcVar12 = std::unique_ptr<cs_active,_void_(*)(void_*)>::operator->
                        ((unique_ptr<cs_active,_void_(*)(void_*)> *)0x2c0d97);
    pcVar12->use_domination = false;
  }
  uVar13 = local_28._24_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b38,"cs_active",&local_b39);
  bVar10 = (**(code **)(*(long *)uVar13 + 8))(uVar13,local_b38);
  std::__cxx11::string::~string(local_b38);
  std::allocator<char>::~allocator((allocator<char> *)&local_b39);
  uVar13 = local_28._16_8_;
  if (((bVar10 ^ 0xff) & 1) == 0) {
    pcVar12 = std::unique_ptr<cs_active,_void_(*)(void_*)>::operator->
                        ((unique_ptr<cs_active,_void_(*)(void_*)> *)0x2c1747);
    pcVar12->all = (vw *)uVar13;
    pcVar12 = std::unique_ptr<cs_active,_void_(*)(void_*)>::operator->
                        ((unique_ptr<cs_active,_void_(*)(void_*)> *)0x2c1760);
    pcVar12->t = 1;
    (**(*(loss_function **)(local_28._16_8_ + 0x3548))->_vptr_loss_function)(local_b60);
    bVar11 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_ffffffffffffe850,(char *)in_stack_ffffffffffffe848);
    uVar13 = local_28._24_8_;
    if (bVar11) {
      std::__cxx11::stringstream::stringstream(local_ce8);
      iVar15 = (int)((ulong)in_stack_ffffffffffffe870 >> 0x20);
      std::operator<<(&local_cd8,"error: you can\'t use non-squared loss with cs_active");
      local_d09 = 1;
      uVar13 = __cxa_allocate_exception(0x38);
      std::__cxx11::stringstream::str();
      VW::vw_exception::vw_exception
                (in_stack_ffffffffffffe880,in_stack_ffffffffffffe878,iVar15,
                 in_stack_ffffffffffffe868);
      local_d09 = 0;
      __cxa_throw(uVar13,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d30,"lda",&local_d31);
    bVar10 = (**(code **)(*(long *)uVar13 + 8))(uVar13,local_d30);
    std::__cxx11::string::~string(local_d30);
    std::allocator<char>::~allocator((allocator<char> *)&local_d31);
    uVar13 = local_28._24_8_;
    if ((bVar10 & 1) != 0) {
      std::__cxx11::stringstream::stringstream(local_ec0);
      iVar15 = (int)((ulong)in_stack_ffffffffffffe870 >> 0x20);
      std::operator<<(&local_eb0,"error: you can\'t combine lda and active learning");
      local_ee1 = 1;
      uVar13 = __cxa_allocate_exception(0x38);
      std::__cxx11::stringstream::str();
      VW::vw_exception::vw_exception
                (in_stack_ffffffffffffe880,in_stack_ffffffffffffe878,iVar15,
                 in_stack_ffffffffffffe868);
      local_ee1 = 0;
      __cxa_throw(uVar13,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f08,"active",&local_f09);
    bVar10 = (**(code **)(*(long *)uVar13 + 8))(uVar13,local_f08);
    std::__cxx11::string::~string(local_f08);
    std::allocator<char>::~allocator((allocator<char> *)&local_f09);
    uVar13 = local_28._24_8_;
    if ((bVar10 & 1) != 0) {
      std::__cxx11::stringstream::stringstream(local_1098);
      iVar15 = (int)((ulong)in_stack_ffffffffffffe870 >> 0x20);
      std::operator<<(&local_1088,"error: you can\'t use --cs_active and --active at the same time")
      ;
      local_10b9 = 1;
      uVar13 = __cxa_allocate_exception(0x38);
      std::__cxx11::stringstream::str();
      VW::vw_exception::vw_exception
                (in_stack_ffffffffffffe880,in_stack_ffffffffffffe878,iVar15,
                 in_stack_ffffffffffffe868);
      local_10b9 = 0;
      __cxa_throw(uVar13,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_10e0,"active_cover",&local_10e1);
    bVar10 = (**(code **)(*(long *)uVar13 + 8))(uVar13,local_10e0);
    std::__cxx11::string::~string(local_10e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_10e1);
    uVar13 = local_28._24_8_;
    if ((bVar10 & 1) != 0) {
      std::__cxx11::stringstream::stringstream(local_1270);
      iVar15 = (int)((ulong)in_stack_ffffffffffffe870 >> 0x20);
      std::operator<<(&local_1260,
                      "error: you can\'t use --cs_active and --active_cover at the same time");
      local_1291 = 1;
      uVar13 = __cxa_allocate_exception(0x38);
      std::__cxx11::stringstream::str();
      VW::vw_exception::vw_exception
                (in_stack_ffffffffffffe880,in_stack_ffffffffffffe878,iVar15,
                 in_stack_ffffffffffffe868);
      local_1291 = 0;
      __cxa_throw(uVar13,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_12b8,"csoaa",&local_12b9);
    bVar10 = (**(code **)(*(long *)uVar13 + 8))(uVar13,local_12b8);
    std::__cxx11::string::~string(local_12b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_12b9);
    if ((bVar10 & 1) != 0) {
      std::__cxx11::stringstream::stringstream(local_1448);
      iVar15 = (int)((ulong)in_stack_ffffffffffffe870 >> 0x20);
      std::operator<<(&local_1438,"error: you can\'t use --cs_active and --csoaa at the same time");
      local_1469 = 1;
      uVar13 = __cxa_allocate_exception(0x38);
      std::__cxx11::stringstream::str();
      VW::vw_exception::vw_exception
                (in_stack_ffffffffffffe880,in_stack_ffffffffffffe878,iVar15,
                 in_stack_ffffffffffffe868);
      local_1469 = 0;
      __cxa_throw(uVar13,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1490,"adax",&local_1491);
    bVar10 = (**(code **)(*(long *)local_28._24_8_ + 8))(local_28._24_8_,local_1490);
    std::__cxx11::string::~string(local_1490);
    std::allocator<char>::~allocator((allocator<char> *)&local_1491);
    if (((bVar10 ^ 0xff) & 1) != 0) {
      this = std::operator<<((ostream *)(local_28._16_8_ + 0xe0),
                             "WARNING: --cs_active should be used with --adax");
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    }
    ppVar1 = *(parser **)(local_28._16_8_ + 8);
    (ppVar1->lp).label_size = DAT_0048cc98;
    puVar9 = PTR_test_label_0048cc90;
    puVar8 = PTR_weight_0048cc80;
    puVar7 = PTR_delete_label_0048cc78;
    puVar6 = PTR_read_cached_label_0048cc70;
    puVar5 = PTR_cache_label_0048cc68;
    puVar4 = PTR_parse_label_0048cc60;
    puVar3 = COST_SENSITIVE::cs_label;
    (ppVar1->lp).copy_label = (_func_void_void_ptr_void_ptr *)PTR_copy_label_0048cc88;
    (ppVar1->lp).test_label = (_func_bool_void_ptr *)puVar9;
    (ppVar1->lp).delete_label = (_func_void_void_ptr *)puVar7;
    (ppVar1->lp).get_weight = (_func_float_void_ptr *)puVar8;
    (ppVar1->lp).cache_label = (_func_void_void_ptr_io_buf_ptr *)puVar5;
    (ppVar1->lp).read_cached_label = (_func_size_t_shared_data_ptr_void_ptr_io_buf_ptr *)puVar6;
    (ppVar1->lp).default_label = (_func_void_void_ptr *)puVar3;
    (ppVar1->lp).parse_label =
         (_func_void_parser_ptr_shared_data_ptr_void_ptr_v_array<substring>_ptr *)puVar4;
    psVar17 = *(shared_data **)local_28._16_8_;
    p_Var2 = *(_func_void_shared_data_ptr_float **)(local_28._16_8_ + 0x40);
    pcVar12 = std::unique_ptr<cs_active,_void_(*)(void_*)>::operator->
                        ((unique_ptr<cs_active,_void_(*)(void_*)> *)0x2c2244);
    (*p_Var2)(psVar17,pcVar12->cost_max);
    psVar17 = *(shared_data **)local_28._16_8_;
    p_Var2 = *(_func_void_shared_data_ptr_float **)(local_28._16_8_ + 0x40);
    pcVar12 = std::unique_ptr<cs_active,_void_(*)(void_*)>::operator->
                        ((unique_ptr<cs_active,_void_(*)(void_*)> *)0x2c2280);
    (*p_Var2)(psVar17,pcVar12->cost_min);
    local_1498 = 0;
    while (uVar16 = local_1498,
          pcVar12 = std::unique_ptr<cs_active,_void_(*)(void_*)>::operator->
                              ((unique_ptr<cs_active,_void_(*)(void_*)> *)0x2c22b9),
          uVar16 < pcVar12->num_classes + 1) {
      std::unique_ptr<cs_active,_void_(*)(void_*)>::operator->
                ((unique_ptr<cs_active,_void_(*)(void_*)> *)0x2c22d7);
      v_array<unsigned_long>::push_back
                ((v_array<unsigned_long> *)in_stack_ffffffffffffe850,
                 (unsigned_long *)in_stack_ffffffffffffe848);
      local_1498 = local_1498 + 1;
    }
    if ((local_29 & 1) == 0) {
      in_stack_ffffffffffffe868 =
           (string *)setup_base((options_i *)in_stack_ffffffffffffe858,in_stack_ffffffffffffe850);
      pVar14 = (prediction_type_t)((ulong)in_stack_ffffffffffffe848 >> 0x20);
      in_stack_ffffffffffffe860 =
           (typed_option<float> *)LEARNER::as_singleline<char,char>((learner<char,_char> *)l_00);
      in_stack_ffffffffffffe850 = (vw *)local_28;
      std::unique_ptr<cs_active,_void_(*)(void_*)>::operator->
                ((unique_ptr<cs_active,_void_(*)(void_*)> *)0x2c23d2);
      this_00 = LEARNER::init_learner<cs_active,example,LEARNER::learner<char,example>>
                          (in_stack_ffffffffffffe870,
                           (learner<char,_example> *)in_stack_ffffffffffffe868,
                           (_func_void_cs_active_ptr_learner<char,_example>_ptr_example_ptr *)
                           in_stack_ffffffffffffe860,
                           (_func_void_cs_active_ptr_learner<char,_example>_ptr_example_ptr *)
                           in_stack_ffffffffffffe858,(size_t)in_stack_ffffffffffffe850,pVar14);
    }
    else {
      setup_base((options_i *)in_stack_ffffffffffffe858,in_stack_ffffffffffffe850);
      pVar14 = (prediction_type_t)((ulong)in_stack_ffffffffffffe848 >> 0x20);
      LEARNER::as_singleline<char,char>((learner<char,_char> *)l_00);
      std::unique_ptr<cs_active,_void_(*)(void_*)>::operator->
                ((unique_ptr<cs_active,_void_(*)(void_*)> *)0x2c2357);
      this_00 = LEARNER::init_learner<cs_active,example,LEARNER::learner<char,example>>
                          (in_stack_ffffffffffffe870,
                           (learner<char,_example> *)in_stack_ffffffffffffe868,
                           (_func_void_cs_active_ptr_learner<char,_example>_ptr_example_ptr *)
                           in_stack_ffffffffffffe860,
                           (_func_void_cs_active_ptr_learner<char,_example>_ptr_example_ptr *)
                           in_stack_ffffffffffffe858,(size_t)in_stack_ffffffffffffe850,pVar14);
    }
    this_01 = this_00;
    LEARNER::learner<cs_active,_example>::set_finish_example(this_00,finish_example);
    LEARNER::learner<cs_active,_example>::set_finish
              (this_01,(_func_void_cs_active_ptr *)in_stack_ffffffffffffe868);
    local_8 = (AllReduce *)LEARNER::make_base<cs_active,example>(this_00);
    *(AllReduce **)(local_28._16_8_ + 0x38) = local_8;
    local_b40 = 1;
    std::__cxx11::string::~string(local_b60);
  }
  else {
    local_8 = (AllReduce *)0x0;
    local_b40 = 1;
  }
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_ffffffffffffe850);
  std::unique_ptr<cs_active,_void_(*)(void_*)>::~unique_ptr
            ((unique_ptr<cs_active,_void_(*)(void_*)> *)in_stack_ffffffffffffe860);
  return (base_learner *)local_8;
}

Assistant:

base_learner* cs_active_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<cs_active>();

  bool simulation = false;
  int domination;
  option_group_definition new_options("Cost-sensitive Active Learning");
  new_options
      .add(make_option("cs_active", data->num_classes).keep().help("Cost-sensitive active learning with <k> costs"))
      .add(make_option("simulation", simulation).help("cost-sensitive active learning simulation mode"))
      .add(make_option("baseline", data->is_baseline).help("cost-sensitive active learning baseline"))
      .add(make_option("domination", domination)
               .default_value(1)
               .help("cost-sensitive active learning use domination. Default 1"))
      .add(make_option("mellowness", data->c0).default_value(0.1f).help("mellowness parameter c_0. Default 0.1."))
      .add(make_option("range_c", data->c1)
               .default_value(0.5f)
               .help("parameter controlling the threshold for per-label cost uncertainty. Default 0.5."))
      .add(make_option("max_labels", data->max_labels).default_value(-1).help("maximum number of label queries."))
      .add(make_option("min_labels", data->min_labels).default_value(-1).help("minimum number of label queries."))
      .add(make_option("cost_max", data->cost_max).default_value(1.f).help("cost upper bound. Default 1."))
      .add(make_option("cost_min", data->cost_min).default_value(0.f).help("cost lower bound. Default 0."))
      // TODO replace with trace and quiet
      .add(make_option("csa_debug", data->print_debug_stuff).help("print debug stuff for cs_active"));
  options.add_and_parse(new_options);

  data->use_domination = true;
  if (options.was_supplied("domination") && !domination)
    data->use_domination = false;

  if (!options.was_supplied("cs_active"))
    return nullptr;

  data->all = &all;
  data->t = 1;

  auto loss_function_type = all.loss->getType();
  if (loss_function_type != "squared")
    THROW("error: you can't use non-squared loss with cs_active");

  if (options.was_supplied("lda"))
    THROW("error: you can't combine lda and active learning");

  if (options.was_supplied("active"))
    THROW("error: you can't use --cs_active and --active at the same time");

  if (options.was_supplied("active_cover"))
    THROW("error: you can't use --cs_active and --active_cover at the same time");

  if (options.was_supplied("csoaa"))
    THROW("error: you can't use --cs_active and --csoaa at the same time");

  if (!options.was_supplied("adax"))
    all.trace_message << "WARNING: --cs_active should be used with --adax" << endl;

  all.p->lp = cs_label;  // assigning the label parser
  all.set_minmax(all.sd, data->cost_max);
  all.set_minmax(all.sd, data->cost_min);
  for (uint32_t i = 0; i < data->num_classes + 1; i++) data->examples_by_queries.push_back(0);

  learner<cs_active, example>& l = simulation
      ? init_learner(data, as_singleline(setup_base(options, all)), predict_or_learn<true, true>,
            predict_or_learn<false, true>, data->num_classes, prediction_type::multilabels)
      : init_learner(data, as_singleline(setup_base(options, all)), predict_or_learn<true, false>,
            predict_or_learn<false, false>, data->num_classes, prediction_type::multilabels);

  l.set_finish_example(finish_example);
  l.set_finish(finish);
  base_learner* b = make_base(l);
  all.cost_sensitive = b;
  return b;
}